

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O1

OperatorKey * Kernel::OperatorType::setupKey(uint arity,TermList *sorts)

{
  Vector<Kernel::TermList> *pVVar1;
  TermList TVar2;
  ulong uVar3;
  
  pVVar1 = ::Lib::Vector<Kernel::TermList>::allocate((ulong)(arity + 1));
  if (sorts == (TermList *)0x0) {
    if (arity != 0) {
      uVar3 = 0;
      do {
        TVar2 = AtomicSort::defaultSort();
        *(uint64_t *)(pVVar1 + uVar3 * 8 + 8) = TVar2._content;
        uVar3 = uVar3 + 1;
      } while (arity != uVar3);
    }
  }
  else if (arity != 0) {
    uVar3 = 0;
    do {
      *(uint64_t *)(pVVar1 + uVar3 * 8 + 8) = sorts[uVar3]._content;
      uVar3 = uVar3 + 1;
    } while (arity != uVar3);
  }
  return pVVar1;
}

Assistant:

OperatorType::OperatorKey* OperatorType::setupKey(unsigned arity, const TermList* sorts)
{
  OperatorKey* key = OperatorKey::allocate(arity+1);

  if (!sorts) {
    // initialise all argument types to the default type
    for (unsigned i=0; i < arity; i++) {
      (*key)[i] = AtomicSort::defaultSort();
    }
  } else {
    // initialise all the argument types to those taken from sorts
    for (unsigned i = 0; i < arity; i++) {
      ASS(sorts[i].isVar() || sorts[i].term()->isSort());
      (*key)[i] = sorts[i];
    }
  }
  return key;
}